

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O0

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<10,_11,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int in_ECX;
  Matrix<float,_2,_4> *extraout_RDX;
  Matrix<float,_2,_4> *extraout_RDX_00;
  Matrix<float,_2,_4> *mat;
  VecAccess<float,_4,_3> local_90;
  Matrix<float,_2,_4> local_64;
  Vector<float,_3> local_44;
  undefined1 local_38 [8];
  Type in0;
  InputType in1Type_local;
  InputType in0Type_local;
  ShaderEvalContext *evalCtx_local;
  
  in0.m_data.m_data[3].m_data[0] = (float)in1Type;
  in0.m_data.m_data[3].m_data[1] = (float)in0Type;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    getInputValue<2,11>((Mat4x2 *)local_38,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,
                        in_ECX);
    mat = extraout_RDX;
  }
  else {
    getInputValue<0,11>((Mat4x2 *)local_38,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,
                        in_ECX);
    mat = extraout_RDX_00;
  }
  negate<float,2,4>(&local_64,(MatrixCaseUtils *)local_38,mat);
  reduceToVec3((MatrixCaseUtils *)&local_44,&local_64);
  tcu::Vector<float,_4>::xyz(&local_90,&evalCtx->color);
  tcu::VecAccess<float,_4,_3>::operator=(&local_90,&local_44);
  tcu::Matrix<float,_2,_4>::~Matrix(&local_64);
  tcu::Matrix<float,_2,_4>::~Matrix((Matrix<float,_2,_4> *)local_38);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(negate(in0));
	}